

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O0

void xmlHashScanFull3(xmlHashTablePtr hash,xmlChar *key,xmlChar *key2,xmlChar *key3,
                     xmlHashScannerFull scan,void *data)

{
  int iVar1;
  bool bVar2;
  uint local_74;
  undefined1 local_70 [4];
  uint i;
  xmlHashEntry old;
  xmlHashEntry *end;
  xmlHashEntry *entry;
  void *data_local;
  xmlHashScannerFull scan_local;
  xmlChar *key3_local;
  xmlChar *key2_local;
  xmlChar *key_local;
  xmlHashTablePtr hash_local;
  
  if (((hash != (xmlHashTablePtr)0x0) && (hash->size != 0)) && (scan != (xmlHashScannerFull)0x0)) {
    end = hash->table;
    old.payload = hash->table + hash->size;
    while (end->hashValue != 0) {
      end = end + 1;
      if (old.payload <= end) {
        end = hash->table;
      }
    }
    for (local_74 = 0; local_74 < hash->size; local_74 = local_74 + 1) {
      if ((end->hashValue != 0) && (end->payload != (void *)0x0)) {
        do {
          if (((key != (xmlChar *)0x0) && (iVar1 = strcmp((char *)key,(char *)end->key), iVar1 != 0)
              ) || (((key2 != (xmlChar *)0x0 &&
                     (iVar1 = xmlFastStrEqual(key2,end->key2), iVar1 == 0)) ||
                    ((key3 != (xmlChar *)0x0 &&
                     (iVar1 = xmlFastStrEqual(key3,end->key3), iVar1 == 0)))))) break;
          memcpy(local_70,end,0x28);
          (*scan)(end->payload,data,end->key,end->key2,end->key3);
          bVar2 = false;
          if ((((end->hashValue != 0) && (bVar2 = false, end->payload != (void *)0x0)) &&
              (bVar2 = true, end->key == (xmlChar *)old._0_8_)) &&
             (bVar2 = true, end->key2 == old.key)) {
            bVar2 = end->key3 != old.key2;
          }
        } while (bVar2);
      }
      end = end + 1;
      if (old.payload <= end) {
        end = hash->table;
      }
    }
  }
  return;
}

Assistant:

void
xmlHashScanFull3(xmlHashTablePtr hash, const xmlChar *key,
                 const xmlChar *key2, const xmlChar *key3,
                 xmlHashScannerFull scan, void *data) {
    const xmlHashEntry *entry, *end;
    xmlHashEntry old;
    unsigned i;

    if ((hash == NULL) || (hash->size == 0) || (scan == NULL))
        return;

    /*
     * We must handle the case that a scanned entry is removed when executing
     * the callback (xmlCleanSpecialAttr and possibly other places).
     *
     * Find the start of a probe sequence to avoid scanning entries twice if
     * a deletion happens.
     */
    entry = hash->table;
    end = &hash->table[hash->size];
    while (entry->hashValue != 0) {
        if (++entry >= end)
            entry = hash->table;
    }

    for (i = 0; i < hash->size; i++) {
        if ((entry->hashValue != 0) && (entry->payload != NULL)) {
            /*
             * Make sure to rescan after a possible deletion.
             */
            do {
                if (((key != NULL) && (strcmp((const char *) key,
                                              (const char *) entry->key) != 0)) ||
                    ((key2 != NULL) && (!xmlFastStrEqual(key2, entry->key2))) ||
                    ((key3 != NULL) && (!xmlFastStrEqual(key3, entry->key3))))
                    break;
                old = *entry;
                scan(entry->payload, data, entry->key, entry->key2, entry->key3);
            } while ((entry->hashValue != 0) &&
                     (entry->payload != NULL) &&
                     ((entry->key != old.key) ||
                      (entry->key2 != old.key2) ||
                      (entry->key3 != old.key3)));
        }
        if (++entry >= end)
            entry = hash->table;
    }
}